

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O3

int run_test_utf8_decode1_overrun(void)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined1 (*extraout_RDX) [16];
  char *in_R10;
  undefined1 auVar5 [16];
  undefined8 uStack_260;
  char *pcStack_258;
  ssize_t sStack_250;
  undefined8 uStack_248;
  char acStack_240 [256];
  long alStack_140 [28];
  undefined8 uStack_60;
  char *pcStack_58;
  char *pcStack_50;
  char *pcStack_48;
  code *apcStack_40 [2];
  char b [1];
  char c [1];
  int64_t eval_b;
  int64_t eval_a;
  char *p;
  
  b[0] = '\x7f';
  eval_a = 0x7f;
  apcStack_40[0] = (code *)0x1a143c;
  p = b;
  uVar1 = uv__utf8_decode1(&p,c);
  eval_b = (int64_t)uVar1;
  if (eval_a == eval_b) {
    in_R10 = p;
    if (p == c) {
      b[0] = -0x40;
      eval_a = 0xffffffff;
      apcStack_40[0] = (code *)0x1a1480;
      p = b;
      uVar1 = uv__utf8_decode1(&p,c);
      eval_b = (int64_t)uVar1;
      if (eval_a == eval_b) {
        in_R10 = p;
        if (p == c) {
          b[0] = '\x7f';
          eval_b = -0x16;
          eval_a = -0x16;
          apcStack_40[0] = (code *)0x1a14eb;
          eval_b = uv__idna_toascii(b,c,c,(char *)&eval_b);
          if (eval_a == eval_b) {
            return 0;
          }
          apcStack_40[0] = run_test_idna_toascii;
          run_test_utf8_decode1_overrun_cold_4();
          pcStack_258 = (char *)0x1a15df;
          apcStack_40[0] = (code *)c;
          memset(acStack_240,0,0x100);
          alStack_140[0] = -0x16;
          pcStack_258 = (char *)0x1a1609;
          sStack_250 = uv__idna_toascii(anon_var_dwarf_4d16a,anon_var_dwarf_4d16a + 4,acStack_240,
                                        (char *)alStack_140);
          if (alStack_140[0] == sStack_250) {
            pcStack_258 = (char *)0x1a1633;
            memset(acStack_240,0,0x100);
            alStack_140[0] = -0x16;
            pcStack_258 = (char *)0x1a165d;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_1,run_test_idna_toascii::s_1 + 8,
                                          acStack_240,(char *)alStack_140);
            if (alStack_140[0] != sStack_250) goto LAB_001a52be;
            acStack_240[0] = -0x16;
            acStack_240[1] = -1;
            acStack_240[2] = -1;
            acStack_240[3] = -1;
            acStack_240[4] = -1;
            acStack_240[5] = -1;
            acStack_240[6] = -1;
            acStack_240[7] = -1;
            alStack_140[0] = -0x16;
            pcStack_258 = (char *)0x1a16ae;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a16c2;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a16e0;
            sStack_250 = uv__idna_toascii(".","",acStack_240,(char *)alStack_140);
            uStack_248 = 2;
            if (sStack_250 != 2) goto LAB_001a52e0;
            pcStack_258 = (char *)0x1a1710;
            iVar2 = memcmp(acStack_240,".",2);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a52ed;
            pcStack_258 = (char *)0x1a173b;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a175b;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 2;
            if (sStack_250 != 2) goto LAB_001a52fa;
            pcStack_258 = (char *)0x1a178e;
            iVar2 = memcmp(alStack_140,".",2);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5307;
            pcStack_258 = (char *)0x1a17c3;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5314;
            pcStack_258 = (char *)0x1a17f5;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1809;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1827;
            sStack_250 = uv__idna_toascii(".com","",acStack_240,(char *)alStack_140);
            uStack_248 = 5;
            if (sStack_250 != 5) goto LAB_001a5321;
            pcStack_258 = (char *)0x1a1857;
            iVar2 = memcmp(acStack_240,".com",5);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a532e;
            pcStack_258 = (char *)0x1a1882;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a18a2;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 5;
            if (sStack_250 != 5) goto LAB_001a533b;
            pcStack_258 = (char *)0x1a18d5;
            iVar2 = memcmp(alStack_140,".com",5);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5348;
            pcStack_258 = (char *)0x1a190a;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5355;
            pcStack_258 = (char *)0x1a193c;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1950;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a196e;
            sStack_250 = uv__idna_toascii("example","",acStack_240,(char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a5362;
            pcStack_258 = (char *)0x1a199e;
            iVar2 = memcmp(acStack_240,"example",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a536f;
            pcStack_258 = (char *)0x1a19c9;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a19e9;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a537c;
            pcStack_258 = (char *)0x1a1a1c;
            iVar2 = memcmp(alStack_140,"example",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5389;
            pcStack_258 = (char *)0x1a1a51;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5396;
            pcStack_258 = (char *)0x1a1a83;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1a97;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1ab5;
            sStack_250 = uv__idna_toascii("example-","",acStack_240,(char *)alStack_140);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a53a3;
            pcStack_258 = (char *)0x1a1ae5;
            iVar2 = memcmp(acStack_240,"example-",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a53b0;
            pcStack_258 = (char *)0x1a1b10;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1b30;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a53bd;
            pcStack_258 = (char *)0x1a1b63;
            iVar2 = memcmp(alStack_140,"example-",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a53ca;
            pcStack_258 = (char *)0x1a1b98;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a53d7;
            pcStack_258 = (char *)0x1a1bca;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1bde;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1bfc;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_6,run_test_idna_toascii::s_6 + 10
                                          ,acStack_240,(char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a53e4;
            pcStack_258 = (char *)0x1a1c2c;
            iVar2 = memcmp(acStack_240,"xn--strae-oqa.de",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a53f1;
            pcStack_258 = (char *)0x1a1c57;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1c77;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a53fe;
            pcStack_258 = (char *)0x1a1caa;
            iVar2 = memcmp(alStack_140,"xn--strae-oqa.de",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a540b;
            pcStack_258 = (char *)0x1a1cdf;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5418;
            pcStack_258 = (char *)0x1a1d11;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1d25;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1d43;
            sStack_250 = uv__idna_toascii("foo.bar","",acStack_240,(char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a5425;
            pcStack_258 = (char *)0x1a1d73;
            iVar2 = memcmp(acStack_240,"foo.bar",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5432;
            pcStack_258 = (char *)0x1a1d9e;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1dbe;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a543f;
            pcStack_258 = (char *)0x1a1df1;
            iVar2 = memcmp(alStack_140,"foo.bar",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a544c;
            pcStack_258 = (char *)0x1a1e26;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5459;
            pcStack_258 = (char *)0x1a1e58;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1e6c;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1e8a;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_8,
                                          run_test_idna_toascii::s_8 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a5466;
            pcStack_258 = (char *)0x1a1eba;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5473;
            pcStack_258 = (char *)0x1a1ee5;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a1f05;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a5480;
            pcStack_258 = (char *)0x1a1f38;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a548d;
            pcStack_258 = (char *)0x1a1f6d;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a549a;
            pcStack_258 = (char *)0x1a1f9f;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a1fb3;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a1fd1;
            sStack_250 = uv__idna_toascii("example.com.","",acStack_240,(char *)alStack_140);
            uStack_248 = 0xd;
            if (sStack_250 != 0xd) goto LAB_001a54a7;
            pcStack_258 = (char *)0x1a2001;
            iVar2 = memcmp(acStack_240,"example.com.",0xd);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a54b4;
            pcStack_258 = (char *)0x1a202c;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a204c;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xd;
            if (sStack_250 != 0xd) goto LAB_001a54c1;
            pcStack_258 = (char *)0x1a207f;
            iVar2 = memcmp(alStack_140,"example.com.",0xd);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a54ce;
            pcStack_258 = (char *)0x1a20b4;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a54db;
            pcStack_258 = (char *)0x1a20e6;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a20fa;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2118;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_10,
                                          run_test_idna_toascii::s_10 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a54e8;
            pcStack_258 = (char *)0x1a2148;
            iVar2 = memcmp(acStack_240,"xn--bcher-kva.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a54f5;
            pcStack_258 = (char *)0x1a2173;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2193;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a5502;
            pcStack_258 = (char *)0x1a21c6;
            iVar2 = memcmp(alStack_140,"xn--bcher-kva.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a550f;
            pcStack_258 = (char *)0x1a21fb;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a551c;
            pcStack_258 = (char *)0x1a222d;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2241;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a225f;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_11,
                                          run_test_idna_toascii::s_11 + 9,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a5529;
            pcStack_258 = (char *)0x1a228f;
            iVar2 = memcmp(acStack_240,"xn--caf-dma.com",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5536;
            pcStack_258 = (char *)0x1a22ba;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a22da;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a5543;
            pcStack_258 = (char *)0x1a230d;
            iVar2 = memcmp(alStack_140,"xn--caf-dma.com",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5550;
            pcStack_258 = (char *)0x1a2342;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a555d;
            pcStack_258 = (char *)0x1a2374;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2388;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a23a6;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_12,
                                          run_test_idna_toascii::s_12 + 0xf,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1c;
            if (sStack_250 != 0x1c) goto LAB_001a556a;
            pcStack_258 = (char *)0x1a23d6;
            iVar2 = memcmp(acStack_240,"xn--caf-dma.xn--caf-dma.com",0x1c);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5577;
            pcStack_258 = (char *)0x1a2401;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2421;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1c;
            if (sStack_250 != 0x1c) goto LAB_001a5584;
            pcStack_258 = (char *)0x1a2454;
            iVar2 = memcmp(alStack_140,"xn--caf-dma.xn--caf-dma.com",0x1c);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5591;
            pcStack_258 = (char *)0x1a2489;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a559e;
            pcStack_258 = (char *)0x1a24bb;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a24cf;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a24ed;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_13,
                                          run_test_idna_toascii::s_13 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a55ab;
            pcStack_258 = (char *)0x1a251d;
            iVar2 = memcmp(acStack_240,"xn----dqo34k.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a55b8;
            pcStack_258 = (char *)0x1a2548;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2568;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a55c5;
            pcStack_258 = (char *)0x1a259b;
            iVar2 = memcmp(alStack_140,"xn----dqo34k.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a55d2;
            pcStack_258 = (char *)0x1a25d0;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a55df;
            pcStack_258 = (char *)0x1a2602;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2616;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2634;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_14,
                                          run_test_idna_toascii::s_14 + 0xe,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a55ec;
            pcStack_258 = (char *)0x1a2664;
            iVar2 = memcmp(acStack_240,"xn----dqo34kn65z.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a55f9;
            pcStack_258 = (char *)0x1a268f;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a26af;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a5606;
            pcStack_258 = (char *)0x1a26e2;
            iVar2 = memcmp(alStack_140,"xn----dqo34kn65z.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5613;
            pcStack_258 = (char *)0x1a2717;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5620;
            pcStack_258 = (char *)0x1a2749;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a275d;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a277b;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_15,
                                          run_test_idna_toascii::s_15 + 7,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a562d;
            pcStack_258 = (char *)0x1a27ab;
            iVar2 = memcmp(acStack_240,"xn--ls8h.la",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a563a;
            pcStack_258 = (char *)0x1a27d6;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a27f6;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a5647;
            pcStack_258 = (char *)0x1a2829;
            iVar2 = memcmp(alStack_140,"xn--ls8h.la",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5654;
            pcStack_258 = (char *)0x1a285e;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5661;
            pcStack_258 = (char *)0x1a2890;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a28a4;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a28c2;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_16,
                                          run_test_idna_toascii::s_16 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a566e;
            pcStack_258 = (char *)0x1a28f2;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a567b;
            pcStack_258 = (char *)0x1a291d;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a293d;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a5688;
            pcStack_258 = (char *)0x1a2970;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5695;
            pcStack_258 = (char *)0x1a29a5;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a56a2;
            pcStack_258 = (char *)0x1a29d7;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a29eb;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2a09;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_17,
                                          run_test_idna_toascii::s_17 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a56af;
            pcStack_258 = (char *)0x1a2a39;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a56bc;
            pcStack_258 = (char *)0x1a2a64;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2a84;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a56c9;
            pcStack_258 = (char *)0x1a2ab7;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a56d6;
            pcStack_258 = (char *)0x1a2aec;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a56e3;
            pcStack_258 = (char *)0x1a2b1e;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2b32;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2b50;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_18,
                                          run_test_idna_toascii::s_18 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a56f0;
            pcStack_258 = (char *)0x1a2b80;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a56fd;
            pcStack_258 = (char *)0x1a2bab;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2bcb;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a570a;
            pcStack_258 = (char *)0x1a2bfe;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5717;
            pcStack_258 = (char *)0x1a2c33;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5724;
            pcStack_258 = (char *)0x1a2c65;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2c79;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2c97;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_19,
                                          run_test_idna_toascii::s_19 + 0xd,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a5731;
            pcStack_258 = (char *)0x1a2cc7;
            iVar2 = memcmp(acStack_240,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a573e;
            pcStack_258 = (char *)0x1a2cf2;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2d12;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x12;
            if (sStack_250 != 0x12) goto LAB_001a574b;
            pcStack_258 = (char *)0x1a2d45;
            iVar2 = memcmp(alStack_140,"xn--maana-pta.com",0x12);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5758;
            pcStack_258 = (char *)0x1a2d7a;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5765;
            pcStack_258 = (char *)0x1a2dac;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2dc0;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2dde;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_20,
                                          run_test_idna_toascii::s_20 + 2,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a5772;
            pcStack_258 = (char *)0x1a2e0e;
            iVar2 = memcmp(acStack_240,"xn--tda",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a577f;
            pcStack_258 = (char *)0x1a2e39;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2e59;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 8;
            if (sStack_250 != 8) goto LAB_001a578c;
            pcStack_258 = (char *)0x1a2e8c;
            iVar2 = memcmp(alStack_140,"xn--tda",8);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5799;
            pcStack_258 = (char *)0x1a2ec1;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a57a6;
            pcStack_258 = (char *)0x1a2ef3;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a2f07;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a2f25;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_21,
                                          run_test_idna_toascii::s_21 + 3,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a57b3;
            pcStack_258 = (char *)0x1a2f55;
            iVar2 = memcmp(acStack_240,".xn--tda",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a57c0;
            pcStack_258 = (char *)0x1a2f80;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a2fa0;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 9;
            if (sStack_250 != 9) goto LAB_001a57cd;
            pcStack_258 = (char *)0x1a2fd3;
            iVar2 = memcmp(alStack_140,".xn--tda",9);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a57da;
            pcStack_258 = (char *)0x1a3008;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a57e7;
            pcStack_258 = (char *)0x1a303a;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a304e;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a306c;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_22,
                                          run_test_idna_toascii::s_22 + 5,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a57f4;
            pcStack_258 = (char *)0x1a309c;
            iVar2 = memcmp(acStack_240,"xn--tda.xn--tda",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5801;
            pcStack_258 = (char *)0x1a30c7;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a30e7;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x10;
            if (sStack_250 != 0x10) goto LAB_001a580e;
            pcStack_258 = (char *)0x1a311a;
            iVar2 = memcmp(alStack_140,"xn--tda.xn--tda",0x10);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a581b;
            pcStack_258 = (char *)0x1a314f;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5828;
            pcStack_258 = (char *)0x1a3181;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3195;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a31b3;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_23,
                                          run_test_idna_toascii::s_23 + 6,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a5835;
            pcStack_258 = (char *)0x1a31e3;
            iVar2 = memcmp(acStack_240,"xn--tda.xn--tda.",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5842;
            pcStack_258 = (char *)0x1a320e;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a322e;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a584f;
            pcStack_258 = (char *)0x1a3261;
            iVar2 = memcmp(alStack_140,"xn--tda.xn--tda.",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a585c;
            pcStack_258 = (char *)0x1a3296;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5869;
            pcStack_258 = (char *)0x1a32c8;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a32dc;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a32fa;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_24,
                                          run_test_idna_toascii::s_24 + 0xb,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a5876;
            pcStack_258 = (char *)0x1a332a;
            iVar2 = memcmp(acStack_240,"xn--4can8av2009b",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5883;
            pcStack_258 = (char *)0x1a3355;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3375;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a5890;
            pcStack_258 = (char *)0x1a33a8;
            iVar2 = memcmp(alStack_140,"xn--4can8av2009b",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a589d;
            pcStack_258 = (char *)0x1a33dd;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a58aa;
            pcStack_258 = (char *)0x1a340f;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3423;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3441;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_25,
                                          run_test_idna_toascii::s_25 + 0x44,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x4b;
            if (sStack_250 != 0x4b) goto LAB_001a58b7;
            pcStack_258 = (char *)0x1a3471;
            iVar2 = memcmp(acStack_240,
                           "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal"
                           ,0x4b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a58c4;
            pcStack_258 = (char *)0x1a349c;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a34bc;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x4b;
            if (sStack_250 != 0x4b) goto LAB_001a58d1;
            pcStack_258 = (char *)0x1a34ef;
            iVar2 = memcmp(alStack_140,
                           "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal"
                           ,0x4b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a58de;
            pcStack_258 = (char *)0x1a3524;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a58eb;
            pcStack_258 = (char *)0x1a3556;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a356a;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3588;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_26,
                                          run_test_idna_toascii::s_26 + 0x22,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1b;
            if (sStack_250 != 0x1b) goto LAB_001a58f8;
            pcStack_258 = (char *)0x1a35b8;
            iVar2 = memcmp(acStack_240,"xn--egbpdaj6bu4bxfgehfvwxn",0x1b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5905;
            pcStack_258 = (char *)0x1a35e3;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3603;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1b;
            if (sStack_250 != 0x1b) goto LAB_001a5912;
            pcStack_258 = (char *)0x1a3636;
            iVar2 = memcmp(alStack_140,"xn--egbpdaj6bu4bxfgehfvwxn",0x1b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a591f;
            pcStack_258 = (char *)0x1a366b;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a592c;
            pcStack_258 = (char *)0x1a369d;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a36b1;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a36cf;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_27,
                                          run_test_idna_toascii::s_27 + 0x1b,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a5939;
            pcStack_258 = (char *)0x1a36ff;
            iVar2 = memcmp(acStack_240,"xn--ihqwcrb4cv8a8dqg056pqjye",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5946;
            pcStack_258 = (char *)0x1a372a;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a374a;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a5953;
            pcStack_258 = (char *)0x1a377d;
            iVar2 = memcmp(alStack_140,"xn--ihqwcrb4cv8a8dqg056pqjye",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5960;
            pcStack_258 = (char *)0x1a37b2;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a596d;
            pcStack_258 = (char *)0x1a37e4;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a37f8;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3816;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_28,
                                          run_test_idna_toascii::s_28 + 0x1b,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x20;
            if (sStack_250 != 0x20) goto LAB_001a597a;
            pcStack_258 = (char *)0x1a3846;
            iVar2 = memcmp(acStack_240,"xn--ihqwctvzc91f659drss3x8bo0yb",0x20);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5987;
            pcStack_258 = (char *)0x1a3871;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3891;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x20;
            if (sStack_250 != 0x20) goto LAB_001a5994;
            pcStack_258 = (char *)0x1a38c4;
            iVar2 = memcmp(alStack_140,"xn--ihqwctvzc91f659drss3x8bo0yb",0x20);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a59a1;
            pcStack_258 = (char *)0x1a38f9;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a59ae;
            pcStack_258 = (char *)0x1a392b;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a393f;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a395d;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_29,
                                          run_test_idna_toascii::s_29 + 0x1a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x23;
            if (sStack_250 != 0x23) goto LAB_001a59bb;
            pcStack_258 = (char *)0x1a398d;
            iVar2 = memcmp(acStack_240,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a59c8;
            pcStack_258 = (char *)0x1a39b8;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a39d8;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x23;
            if (sStack_250 != 0x23) goto LAB_001a59d5;
            pcStack_258 = (char *)0x1a3a0b;
            iVar2 = memcmp(alStack_140,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a59e2;
            pcStack_258 = (char *)0x1a3a40;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a59ef;
            pcStack_258 = (char *)0x1a3a72;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3a86;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3aa4;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_30,
                                          run_test_idna_toascii::s_30 + 0x2c,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x21;
            if (sStack_250 != 0x21) goto LAB_001a59fc;
            pcStack_258 = (char *)0x1a3ad4;
            iVar2 = memcmp(acStack_240,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a09;
            pcStack_258 = (char *)0x1a3aff;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3b1f;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x21;
            if (sStack_250 != 0x21) goto LAB_001a5a16;
            pcStack_258 = (char *)0x1a3b52;
            iVar2 = memcmp(alStack_140,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a23;
            pcStack_258 = (char *)0x1a3b87;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a30;
            pcStack_258 = (char *)0x1a3bb9;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3bcd;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3beb;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_31,
                                          run_test_idna_toascii::s_31 + 0x5a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a5a3d;
            pcStack_258 = (char *)0x1a3c1b;
            iVar2 = memcmp(acStack_240,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a4a;
            pcStack_258 = (char *)0x1a3c46;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3c66;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a5a57;
            pcStack_258 = (char *)0x1a3c99;
            iVar2 = memcmp(alStack_140,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a64;
            pcStack_258 = (char *)0x1a3cce;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a71;
            pcStack_258 = (char *)0x1a3d00;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3d14;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3d32;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_32,
                                          run_test_idna_toascii::s_32 + 0x36,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2b;
            if (sStack_250 != 0x2b) goto LAB_001a5a7e;
            pcStack_258 = (char *)0x1a3d62;
            iVar2 = memcmp(acStack_240,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5a8b;
            pcStack_258 = (char *)0x1a3d8d;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3dad;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2b;
            if (sStack_250 != 0x2b) goto LAB_001a5a98;
            pcStack_258 = (char *)0x1a3de0;
            iVar2 = memcmp(alStack_140,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5aa5;
            pcStack_258 = (char *)0x1a3e15;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5ab2;
            pcStack_258 = (char *)0x1a3e47;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3e5b;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3e79;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_33,
                                          run_test_idna_toascii::s_33 + 0x48,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x4a;
            if (sStack_250 != 0x4a) goto LAB_001a5abf;
            pcStack_258 = (char *)0x1a3ea9;
            iVar2 = memcmp(acStack_240,
                           "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c"
                           ,0x4a);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5acc;
            pcStack_258 = (char *)0x1a3ed4;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a3ef4;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x4a;
            if (sStack_250 != 0x4a) goto LAB_001a5ad9;
            pcStack_258 = (char *)0x1a3f27;
            iVar2 = memcmp(alStack_140,
                           "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c"
                           ,0x4a);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5ae6;
            pcStack_258 = (char *)0x1a3f5c;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5af3;
            pcStack_258 = (char *)0x1a3f8e;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a3fa2;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a3fc0;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_34,
                                          run_test_idna_toascii::s_34 + 0x38,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x25;
            if (sStack_250 != 0x25) goto LAB_001a5b00;
            pcStack_258 = (char *)0x1a3ff0;
            iVar2 = memcmp(acStack_240,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b0d;
            pcStack_258 = (char *)0x1a401b;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a403b;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x25;
            if (sStack_250 != 0x25) goto LAB_001a5b1a;
            pcStack_258 = (char *)0x1a406e;
            iVar2 = memcmp(alStack_140,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b27;
            pcStack_258 = (char *)0x1a40a3;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b34;
            pcStack_258 = (char *)0x1a40d5;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a40e9;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4107;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_35,
                                          run_test_idna_toascii::s_35 + 0x2a,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x32;
            if (sStack_250 != 0x32) goto LAB_001a5b41;
            pcStack_258 = (char *)0x1a4137;
            iVar2 = memcmp(acStack_240,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b4e;
            pcStack_258 = (char *)0x1a4162;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4182;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x32;
            if (sStack_250 != 0x32) goto LAB_001a5b5b;
            pcStack_258 = (char *)0x1a41b5;
            iVar2 = memcmp(alStack_140,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b68;
            pcStack_258 = (char *)0x1a41ea;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b75;
            pcStack_258 = (char *)0x1a421c;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4230;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a424e;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_36,
                                          run_test_idna_toascii::s_36 + 0x2d,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a5b82;
            pcStack_258 = (char *)0x1a427e;
            iVar2 = memcmp(acStack_240,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5b8f;
            pcStack_258 = (char *)0x1a42a9;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a42c9;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x31;
            if (sStack_250 != 0x31) goto LAB_001a5b9c;
            pcStack_258 = (char *)0x1a42fc;
            iVar2 = memcmp(alStack_140,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5ba9;
            pcStack_258 = (char *)0x1a4331;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5bb6;
            pcStack_258 = (char *)0x1a4363;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4377;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4395;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_37,
                                          run_test_idna_toascii::s_37 + 0x14,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a5bc3;
            pcStack_258 = (char *)0x1a43c5;
            iVar2 = memcmp(acStack_240,"xn--3B-ww4c5e180e575a65lsy2b",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5bd0;
            pcStack_258 = (char *)0x1a43f0;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4410;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1d;
            if (sStack_250 != 0x1d) goto LAB_001a5bdd;
            pcStack_258 = (char *)0x1a4443;
            iVar2 = memcmp(alStack_140,"xn--3B-ww4c5e180e575a65lsy2b",0x1d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5bea;
            pcStack_258 = (char *)0x1a4478;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5bf7;
            pcStack_258 = (char *)0x1a44aa;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a44be;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a44dc;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_38,
                                          run_test_idna_toascii::s_38 + 0x22,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a5c04;
            pcStack_258 = (char *)0x1a450c;
            iVar2 = memcmp(acStack_240,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c11;
            pcStack_258 = (char *)0x1a4537;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4557;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a5c1e;
            pcStack_258 = (char *)0x1a458a;
            iVar2 = memcmp(alStack_140,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c2b;
            pcStack_258 = (char *)0x1a45bf;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c38;
            pcStack_258 = (char *)0x1a45f1;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4605;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4623;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_39,
                                          run_test_idna_toascii::s_39 + 0x27,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a5c45;
            pcStack_258 = (char *)0x1a4653;
            iVar2 = memcmp(acStack_240,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c52;
            pcStack_258 = (char *)0x1a467e;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a469e;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x2d;
            if (sStack_250 != 0x2d) goto LAB_001a5c5f;
            pcStack_258 = (char *)0x1a46d1;
            iVar2 = memcmp(alStack_140,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c6c;
            pcStack_258 = (char *)0x1a4706;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c79;
            pcStack_258 = (char *)0x1a4738;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a474c;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a476a;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_40,
                                          run_test_idna_toascii::s_40 + 0x16,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a5c86;
            pcStack_258 = (char *)0x1a479a;
            iVar2 = memcmp(acStack_240,"xn--2-u9tlzr9756bt3uc0v",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5c93;
            pcStack_258 = (char *)0x1a47c5;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a47e5;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a5ca0;
            pcStack_258 = (char *)0x1a4818;
            iVar2 = memcmp(alStack_140,"xn--2-u9tlzr9756bt3uc0v",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5cad;
            pcStack_258 = (char *)0x1a484d;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5cba;
            pcStack_258 = (char *)0x1a487f;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4893;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a48b1;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_41,
                                          run_test_idna_toascii::s_41 + 0x17,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x1f;
            if (sStack_250 != 0x1f) goto LAB_001a5cc7;
            pcStack_258 = (char *)0x1a48e1;
            iVar2 = memcmp(acStack_240,"xn--MajiKoi5-783gue6qz075azm5e",0x1f);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5cd4;
            pcStack_258 = (char *)0x1a490c;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a492c;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x1f;
            if (sStack_250 != 0x1f) goto LAB_001a5ce1;
            pcStack_258 = (char *)0x1a495f;
            iVar2 = memcmp(alStack_140,"xn--MajiKoi5-783gue6qz075azm5e",0x1f);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5cee;
            pcStack_258 = (char *)0x1a4994;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5cfb;
            pcStack_258 = (char *)0x1a49c6;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a49da;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a49f8;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_42,
                                          run_test_idna_toascii::s_42 + 0x17,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x16;
            if (sStack_250 != 0x16) goto LAB_001a5d08;
            pcStack_258 = (char *)0x1a4a28;
            iVar2 = memcmp(acStack_240,"xn--de-jg4avhby1noc0d",0x16);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d15;
            pcStack_258 = (char *)0x1a4a53;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4a73;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x16;
            if (sStack_250 != 0x16) goto LAB_001a5d22;
            pcStack_258 = (char *)0x1a4aa6;
            iVar2 = memcmp(alStack_140,"xn--de-jg4avhby1noc0d",0x16);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d2f;
            pcStack_258 = (char *)0x1a4adb;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d3c;
            pcStack_258 = (char *)0x1a4b0d;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4b21;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4b3f;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_43,
                                          run_test_idna_toascii::s_43 + 0x15,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x14;
            if (sStack_250 != 0x14) goto LAB_001a5d49;
            pcStack_258 = (char *)0x1a4b6f;
            iVar2 = memcmp(acStack_240,"xn--d9juau41awczczp",0x14);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d56;
            pcStack_258 = (char *)0x1a4b9a;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4bba;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x14;
            if (sStack_250 != 0x14) goto LAB_001a5d63;
            pcStack_258 = (char *)0x1a4bed;
            iVar2 = memcmp(alStack_140,"xn--d9juau41awczczp",0x14);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d70;
            pcStack_258 = (char *)0x1a4c22;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d7d;
            pcStack_258 = (char *)0x1a4c54;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4c68;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4c86;
            sStack_250 = uv__idna_toascii("-> $1.00 <-","",acStack_240,(char *)alStack_140);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a5d8a;
            pcStack_258 = (char *)0x1a4cb6;
            iVar2 = memcmp(acStack_240,"-> $1.00 <-",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5d97;
            pcStack_258 = (char *)0x1a4ce1;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4d01;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xc;
            if (sStack_250 != 0xc) goto LAB_001a5da4;
            pcStack_258 = (char *)0x1a4d34;
            iVar2 = memcmp(alStack_140,"-> $1.00 <-",0xc);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5db1;
            pcStack_258 = (char *)0x1a4d69;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5dbe;
            pcStack_258 = (char *)0x1a4d9b;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4daf;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4dcd;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_45,
                                          run_test_idna_toascii::s_45 + 7,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0xe;
            if (sStack_250 != 0xe) goto LAB_001a5dcb;
            pcStack_258 = (char *)0x1a4dfd;
            iVar2 = memcmp(acStack_240,"xn--fa-hia.de",0xe);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5dd8;
            pcStack_258 = (char *)0x1a4e28;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4e48;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0xe;
            if (sStack_250 != 0xe) goto LAB_001a5de5;
            pcStack_258 = (char *)0x1a4e7b;
            iVar2 = memcmp(alStack_140,"xn--fa-hia.de",0xe);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5df2;
            pcStack_258 = (char *)0x1a4eb0;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5dff;
            pcStack_258 = (char *)0x1a4ee2;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a4ef6;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a4f14;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_46,
                                          run_test_idna_toascii::s_46 + 0xe,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a5e0c;
            pcStack_258 = (char *)0x1a4f44;
            iVar2 = memcmp(acStack_240,"xn--nxasmm1c.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e19;
            pcStack_258 = (char *)0x1a4f6f;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a4f8f;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x11;
            if (sStack_250 != 0x11) goto LAB_001a5e26;
            pcStack_258 = (char *)0x1a4fc2;
            iVar2 = memcmp(alStack_140,"xn--nxasmm1c.com",0x11);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e33;
            pcStack_258 = (char *)0x1a4ff7;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e40;
            pcStack_258 = (char *)0x1a5029;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a503d;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a505b;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_47,
                                          run_test_idna_toascii::s_47 + 0x13,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a5e4d;
            pcStack_258 = (char *)0x1a508b;
            iVar2 = memcmp(acStack_240,"xn--10cl1a0b660p.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e5a;
            pcStack_258 = (char *)0x1a50b6;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a50d6;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x15;
            if (sStack_250 != 0x15) goto LAB_001a5e67;
            pcStack_258 = (char *)0x1a5109;
            iVar2 = memcmp(alStack_140,"xn--10cl1a0b660p.com",0x15);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e74;
            pcStack_258 = (char *)0x1a513e;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e81;
            pcStack_258 = (char *)0x1a5170;
            memset(acStack_240,0,0x100);
            pcStack_258 = (char *)0x1a5184;
            memset(alStack_140,0,0x100);
            pcStack_258 = (char *)0x1a51a2;
            sStack_250 = uv__idna_toascii(run_test_idna_toascii::s_48,
                                          run_test_idna_toascii::s_48 + 0x13,acStack_240,
                                          (char *)alStack_140);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a5e8e;
            pcStack_258 = (char *)0x1a51d2;
            iVar2 = memcmp(acStack_240,"xn--mgba3gch31f060k.com",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5e9b;
            pcStack_258 = (char *)0x1a51fd;
            sVar3 = strlen(acStack_240);
            pcStack_258 = (char *)0x1a521d;
            sStack_250 = uv__idna_toascii(acStack_240,acStack_240 + sVar3,(char *)alStack_140,
                                          (char *)apcStack_40);
            uStack_248 = 0x18;
            if (sStack_250 != 0x18) goto LAB_001a5ea8;
            pcStack_258 = (char *)0x1a5250;
            iVar2 = memcmp(alStack_140,"xn--mgba3gch31f060k.com",0x18);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 != 0) goto LAB_001a5eb5;
            pcStack_258 = (char *)0x1a5285;
            iVar2 = memcmp(acStack_240,alStack_140,0x100);
            sStack_250 = (ssize_t)iVar2;
            uStack_248 = 0;
            if (sStack_250 == 0) {
              return 0;
            }
          }
          else {
            pcStack_258 = (char *)0x1a52be;
            run_test_idna_toascii_cold_1();
LAB_001a52be:
            pcStack_258 = (char *)0x1a52ce;
            run_test_idna_toascii_cold_2();
            pcStack_258 = (char *)0x1a52e0;
            run_test_idna_toascii_cold_3();
LAB_001a52e0:
            pcStack_258 = (char *)0x1a52ed;
            run_test_idna_toascii_cold_4();
LAB_001a52ed:
            pcStack_258 = (char *)0x1a52fa;
            run_test_idna_toascii_cold_5();
LAB_001a52fa:
            pcStack_258 = (char *)0x1a5307;
            run_test_idna_toascii_cold_6();
LAB_001a5307:
            pcStack_258 = (char *)0x1a5314;
            run_test_idna_toascii_cold_7();
LAB_001a5314:
            pcStack_258 = (char *)0x1a5321;
            run_test_idna_toascii_cold_8();
LAB_001a5321:
            pcStack_258 = (char *)0x1a532e;
            run_test_idna_toascii_cold_9();
LAB_001a532e:
            pcStack_258 = (char *)0x1a533b;
            run_test_idna_toascii_cold_10();
LAB_001a533b:
            pcStack_258 = (char *)0x1a5348;
            run_test_idna_toascii_cold_11();
LAB_001a5348:
            pcStack_258 = (char *)0x1a5355;
            run_test_idna_toascii_cold_12();
LAB_001a5355:
            pcStack_258 = (char *)0x1a5362;
            run_test_idna_toascii_cold_13();
LAB_001a5362:
            pcStack_258 = (char *)0x1a536f;
            run_test_idna_toascii_cold_14();
LAB_001a536f:
            pcStack_258 = (char *)0x1a537c;
            run_test_idna_toascii_cold_15();
LAB_001a537c:
            pcStack_258 = (char *)0x1a5389;
            run_test_idna_toascii_cold_16();
LAB_001a5389:
            pcStack_258 = (char *)0x1a5396;
            run_test_idna_toascii_cold_17();
LAB_001a5396:
            pcStack_258 = (char *)0x1a53a3;
            run_test_idna_toascii_cold_18();
LAB_001a53a3:
            pcStack_258 = (char *)0x1a53b0;
            run_test_idna_toascii_cold_19();
LAB_001a53b0:
            pcStack_258 = (char *)0x1a53bd;
            run_test_idna_toascii_cold_20();
LAB_001a53bd:
            pcStack_258 = (char *)0x1a53ca;
            run_test_idna_toascii_cold_21();
LAB_001a53ca:
            pcStack_258 = (char *)0x1a53d7;
            run_test_idna_toascii_cold_22();
LAB_001a53d7:
            pcStack_258 = (char *)0x1a53e4;
            run_test_idna_toascii_cold_23();
LAB_001a53e4:
            pcStack_258 = (char *)0x1a53f1;
            run_test_idna_toascii_cold_24();
LAB_001a53f1:
            pcStack_258 = (char *)0x1a53fe;
            run_test_idna_toascii_cold_25();
LAB_001a53fe:
            pcStack_258 = (char *)0x1a540b;
            run_test_idna_toascii_cold_26();
LAB_001a540b:
            pcStack_258 = (char *)0x1a5418;
            run_test_idna_toascii_cold_27();
LAB_001a5418:
            pcStack_258 = (char *)0x1a5425;
            run_test_idna_toascii_cold_28();
LAB_001a5425:
            pcStack_258 = (char *)0x1a5432;
            run_test_idna_toascii_cold_29();
LAB_001a5432:
            pcStack_258 = (char *)0x1a543f;
            run_test_idna_toascii_cold_30();
LAB_001a543f:
            pcStack_258 = (char *)0x1a544c;
            run_test_idna_toascii_cold_31();
LAB_001a544c:
            pcStack_258 = (char *)0x1a5459;
            run_test_idna_toascii_cold_32();
LAB_001a5459:
            pcStack_258 = (char *)0x1a5466;
            run_test_idna_toascii_cold_33();
LAB_001a5466:
            pcStack_258 = (char *)0x1a5473;
            run_test_idna_toascii_cold_34();
LAB_001a5473:
            pcStack_258 = (char *)0x1a5480;
            run_test_idna_toascii_cold_35();
LAB_001a5480:
            pcStack_258 = (char *)0x1a548d;
            run_test_idna_toascii_cold_36();
LAB_001a548d:
            pcStack_258 = (char *)0x1a549a;
            run_test_idna_toascii_cold_37();
LAB_001a549a:
            pcStack_258 = (char *)0x1a54a7;
            run_test_idna_toascii_cold_38();
LAB_001a54a7:
            pcStack_258 = (char *)0x1a54b4;
            run_test_idna_toascii_cold_39();
LAB_001a54b4:
            pcStack_258 = (char *)0x1a54c1;
            run_test_idna_toascii_cold_40();
LAB_001a54c1:
            pcStack_258 = (char *)0x1a54ce;
            run_test_idna_toascii_cold_41();
LAB_001a54ce:
            pcStack_258 = (char *)0x1a54db;
            run_test_idna_toascii_cold_42();
LAB_001a54db:
            pcStack_258 = (char *)0x1a54e8;
            run_test_idna_toascii_cold_43();
LAB_001a54e8:
            pcStack_258 = (char *)0x1a54f5;
            run_test_idna_toascii_cold_44();
LAB_001a54f5:
            pcStack_258 = (char *)0x1a5502;
            run_test_idna_toascii_cold_45();
LAB_001a5502:
            pcStack_258 = (char *)0x1a550f;
            run_test_idna_toascii_cold_46();
LAB_001a550f:
            pcStack_258 = (char *)0x1a551c;
            run_test_idna_toascii_cold_47();
LAB_001a551c:
            pcStack_258 = (char *)0x1a5529;
            run_test_idna_toascii_cold_48();
LAB_001a5529:
            pcStack_258 = (char *)0x1a5536;
            run_test_idna_toascii_cold_49();
LAB_001a5536:
            pcStack_258 = (char *)0x1a5543;
            run_test_idna_toascii_cold_50();
LAB_001a5543:
            pcStack_258 = (char *)0x1a5550;
            run_test_idna_toascii_cold_51();
LAB_001a5550:
            pcStack_258 = (char *)0x1a555d;
            run_test_idna_toascii_cold_52();
LAB_001a555d:
            pcStack_258 = (char *)0x1a556a;
            run_test_idna_toascii_cold_53();
LAB_001a556a:
            pcStack_258 = (char *)0x1a5577;
            run_test_idna_toascii_cold_54();
LAB_001a5577:
            pcStack_258 = (char *)0x1a5584;
            run_test_idna_toascii_cold_55();
LAB_001a5584:
            pcStack_258 = (char *)0x1a5591;
            run_test_idna_toascii_cold_56();
LAB_001a5591:
            pcStack_258 = (char *)0x1a559e;
            run_test_idna_toascii_cold_57();
LAB_001a559e:
            pcStack_258 = (char *)0x1a55ab;
            run_test_idna_toascii_cold_58();
LAB_001a55ab:
            pcStack_258 = (char *)0x1a55b8;
            run_test_idna_toascii_cold_59();
LAB_001a55b8:
            pcStack_258 = (char *)0x1a55c5;
            run_test_idna_toascii_cold_60();
LAB_001a55c5:
            pcStack_258 = (char *)0x1a55d2;
            run_test_idna_toascii_cold_61();
LAB_001a55d2:
            pcStack_258 = (char *)0x1a55df;
            run_test_idna_toascii_cold_62();
LAB_001a55df:
            pcStack_258 = (char *)0x1a55ec;
            run_test_idna_toascii_cold_63();
LAB_001a55ec:
            pcStack_258 = (char *)0x1a55f9;
            run_test_idna_toascii_cold_64();
LAB_001a55f9:
            pcStack_258 = (char *)0x1a5606;
            run_test_idna_toascii_cold_65();
LAB_001a5606:
            pcStack_258 = (char *)0x1a5613;
            run_test_idna_toascii_cold_66();
LAB_001a5613:
            pcStack_258 = (char *)0x1a5620;
            run_test_idna_toascii_cold_67();
LAB_001a5620:
            pcStack_258 = (char *)0x1a562d;
            run_test_idna_toascii_cold_68();
LAB_001a562d:
            pcStack_258 = (char *)0x1a563a;
            run_test_idna_toascii_cold_69();
LAB_001a563a:
            pcStack_258 = (char *)0x1a5647;
            run_test_idna_toascii_cold_70();
LAB_001a5647:
            pcStack_258 = (char *)0x1a5654;
            run_test_idna_toascii_cold_71();
LAB_001a5654:
            pcStack_258 = (char *)0x1a5661;
            run_test_idna_toascii_cold_72();
LAB_001a5661:
            pcStack_258 = (char *)0x1a566e;
            run_test_idna_toascii_cold_73();
LAB_001a566e:
            pcStack_258 = (char *)0x1a567b;
            run_test_idna_toascii_cold_74();
LAB_001a567b:
            pcStack_258 = (char *)0x1a5688;
            run_test_idna_toascii_cold_75();
LAB_001a5688:
            pcStack_258 = (char *)0x1a5695;
            run_test_idna_toascii_cold_76();
LAB_001a5695:
            pcStack_258 = (char *)0x1a56a2;
            run_test_idna_toascii_cold_77();
LAB_001a56a2:
            pcStack_258 = (char *)0x1a56af;
            run_test_idna_toascii_cold_78();
LAB_001a56af:
            pcStack_258 = (char *)0x1a56bc;
            run_test_idna_toascii_cold_79();
LAB_001a56bc:
            pcStack_258 = (char *)0x1a56c9;
            run_test_idna_toascii_cold_80();
LAB_001a56c9:
            pcStack_258 = (char *)0x1a56d6;
            run_test_idna_toascii_cold_81();
LAB_001a56d6:
            pcStack_258 = (char *)0x1a56e3;
            run_test_idna_toascii_cold_82();
LAB_001a56e3:
            pcStack_258 = (char *)0x1a56f0;
            run_test_idna_toascii_cold_83();
LAB_001a56f0:
            pcStack_258 = (char *)0x1a56fd;
            run_test_idna_toascii_cold_84();
LAB_001a56fd:
            pcStack_258 = (char *)0x1a570a;
            run_test_idna_toascii_cold_85();
LAB_001a570a:
            pcStack_258 = (char *)0x1a5717;
            run_test_idna_toascii_cold_86();
LAB_001a5717:
            pcStack_258 = (char *)0x1a5724;
            run_test_idna_toascii_cold_87();
LAB_001a5724:
            pcStack_258 = (char *)0x1a5731;
            run_test_idna_toascii_cold_88();
LAB_001a5731:
            pcStack_258 = (char *)0x1a573e;
            run_test_idna_toascii_cold_89();
LAB_001a573e:
            pcStack_258 = (char *)0x1a574b;
            run_test_idna_toascii_cold_90();
LAB_001a574b:
            pcStack_258 = (char *)0x1a5758;
            run_test_idna_toascii_cold_91();
LAB_001a5758:
            pcStack_258 = (char *)0x1a5765;
            run_test_idna_toascii_cold_92();
LAB_001a5765:
            pcStack_258 = (char *)0x1a5772;
            run_test_idna_toascii_cold_93();
LAB_001a5772:
            pcStack_258 = (char *)0x1a577f;
            run_test_idna_toascii_cold_94();
LAB_001a577f:
            pcStack_258 = (char *)0x1a578c;
            run_test_idna_toascii_cold_95();
LAB_001a578c:
            pcStack_258 = (char *)0x1a5799;
            run_test_idna_toascii_cold_96();
LAB_001a5799:
            pcStack_258 = (char *)0x1a57a6;
            run_test_idna_toascii_cold_97();
LAB_001a57a6:
            pcStack_258 = (char *)0x1a57b3;
            run_test_idna_toascii_cold_98();
LAB_001a57b3:
            pcStack_258 = (char *)0x1a57c0;
            run_test_idna_toascii_cold_99();
LAB_001a57c0:
            pcStack_258 = (char *)0x1a57cd;
            run_test_idna_toascii_cold_100();
LAB_001a57cd:
            pcStack_258 = (char *)0x1a57da;
            run_test_idna_toascii_cold_101();
LAB_001a57da:
            pcStack_258 = (char *)0x1a57e7;
            run_test_idna_toascii_cold_102();
LAB_001a57e7:
            pcStack_258 = (char *)0x1a57f4;
            run_test_idna_toascii_cold_103();
LAB_001a57f4:
            pcStack_258 = (char *)0x1a5801;
            run_test_idna_toascii_cold_104();
LAB_001a5801:
            pcStack_258 = (char *)0x1a580e;
            run_test_idna_toascii_cold_105();
LAB_001a580e:
            pcStack_258 = (char *)0x1a581b;
            run_test_idna_toascii_cold_106();
LAB_001a581b:
            pcStack_258 = (char *)0x1a5828;
            run_test_idna_toascii_cold_107();
LAB_001a5828:
            pcStack_258 = (char *)0x1a5835;
            run_test_idna_toascii_cold_108();
LAB_001a5835:
            pcStack_258 = (char *)0x1a5842;
            run_test_idna_toascii_cold_109();
LAB_001a5842:
            pcStack_258 = (char *)0x1a584f;
            run_test_idna_toascii_cold_110();
LAB_001a584f:
            pcStack_258 = (char *)0x1a585c;
            run_test_idna_toascii_cold_111();
LAB_001a585c:
            pcStack_258 = (char *)0x1a5869;
            run_test_idna_toascii_cold_112();
LAB_001a5869:
            pcStack_258 = (char *)0x1a5876;
            run_test_idna_toascii_cold_113();
LAB_001a5876:
            pcStack_258 = (char *)0x1a5883;
            run_test_idna_toascii_cold_114();
LAB_001a5883:
            pcStack_258 = (char *)0x1a5890;
            run_test_idna_toascii_cold_115();
LAB_001a5890:
            pcStack_258 = (char *)0x1a589d;
            run_test_idna_toascii_cold_116();
LAB_001a589d:
            pcStack_258 = (char *)0x1a58aa;
            run_test_idna_toascii_cold_117();
LAB_001a58aa:
            pcStack_258 = (char *)0x1a58b7;
            run_test_idna_toascii_cold_118();
LAB_001a58b7:
            pcStack_258 = (char *)0x1a58c4;
            run_test_idna_toascii_cold_119();
LAB_001a58c4:
            pcStack_258 = (char *)0x1a58d1;
            run_test_idna_toascii_cold_120();
LAB_001a58d1:
            pcStack_258 = (char *)0x1a58de;
            run_test_idna_toascii_cold_121();
LAB_001a58de:
            pcStack_258 = (char *)0x1a58eb;
            run_test_idna_toascii_cold_122();
LAB_001a58eb:
            pcStack_258 = (char *)0x1a58f8;
            run_test_idna_toascii_cold_123();
LAB_001a58f8:
            pcStack_258 = (char *)0x1a5905;
            run_test_idna_toascii_cold_124();
LAB_001a5905:
            pcStack_258 = (char *)0x1a5912;
            run_test_idna_toascii_cold_125();
LAB_001a5912:
            pcStack_258 = (char *)0x1a591f;
            run_test_idna_toascii_cold_126();
LAB_001a591f:
            pcStack_258 = (char *)0x1a592c;
            run_test_idna_toascii_cold_127();
LAB_001a592c:
            pcStack_258 = (char *)0x1a5939;
            run_test_idna_toascii_cold_128();
LAB_001a5939:
            pcStack_258 = (char *)0x1a5946;
            run_test_idna_toascii_cold_129();
LAB_001a5946:
            pcStack_258 = (char *)0x1a5953;
            run_test_idna_toascii_cold_130();
LAB_001a5953:
            pcStack_258 = (char *)0x1a5960;
            run_test_idna_toascii_cold_131();
LAB_001a5960:
            pcStack_258 = (char *)0x1a596d;
            run_test_idna_toascii_cold_132();
LAB_001a596d:
            pcStack_258 = (char *)0x1a597a;
            run_test_idna_toascii_cold_133();
LAB_001a597a:
            pcStack_258 = (char *)0x1a5987;
            run_test_idna_toascii_cold_134();
LAB_001a5987:
            pcStack_258 = (char *)0x1a5994;
            run_test_idna_toascii_cold_135();
LAB_001a5994:
            pcStack_258 = (char *)0x1a59a1;
            run_test_idna_toascii_cold_136();
LAB_001a59a1:
            pcStack_258 = (char *)0x1a59ae;
            run_test_idna_toascii_cold_137();
LAB_001a59ae:
            pcStack_258 = (char *)0x1a59bb;
            run_test_idna_toascii_cold_138();
LAB_001a59bb:
            pcStack_258 = (char *)0x1a59c8;
            run_test_idna_toascii_cold_139();
LAB_001a59c8:
            pcStack_258 = (char *)0x1a59d5;
            run_test_idna_toascii_cold_140();
LAB_001a59d5:
            pcStack_258 = (char *)0x1a59e2;
            run_test_idna_toascii_cold_141();
LAB_001a59e2:
            pcStack_258 = (char *)0x1a59ef;
            run_test_idna_toascii_cold_142();
LAB_001a59ef:
            pcStack_258 = (char *)0x1a59fc;
            run_test_idna_toascii_cold_143();
LAB_001a59fc:
            pcStack_258 = (char *)0x1a5a09;
            run_test_idna_toascii_cold_144();
LAB_001a5a09:
            pcStack_258 = (char *)0x1a5a16;
            run_test_idna_toascii_cold_145();
LAB_001a5a16:
            pcStack_258 = (char *)0x1a5a23;
            run_test_idna_toascii_cold_146();
LAB_001a5a23:
            pcStack_258 = (char *)0x1a5a30;
            run_test_idna_toascii_cold_147();
LAB_001a5a30:
            pcStack_258 = (char *)0x1a5a3d;
            run_test_idna_toascii_cold_148();
LAB_001a5a3d:
            pcStack_258 = (char *)0x1a5a4a;
            run_test_idna_toascii_cold_149();
LAB_001a5a4a:
            pcStack_258 = (char *)0x1a5a57;
            run_test_idna_toascii_cold_150();
LAB_001a5a57:
            pcStack_258 = (char *)0x1a5a64;
            run_test_idna_toascii_cold_151();
LAB_001a5a64:
            pcStack_258 = (char *)0x1a5a71;
            run_test_idna_toascii_cold_152();
LAB_001a5a71:
            pcStack_258 = (char *)0x1a5a7e;
            run_test_idna_toascii_cold_153();
LAB_001a5a7e:
            pcStack_258 = (char *)0x1a5a8b;
            run_test_idna_toascii_cold_154();
LAB_001a5a8b:
            pcStack_258 = (char *)0x1a5a98;
            run_test_idna_toascii_cold_155();
LAB_001a5a98:
            pcStack_258 = (char *)0x1a5aa5;
            run_test_idna_toascii_cold_156();
LAB_001a5aa5:
            pcStack_258 = (char *)0x1a5ab2;
            run_test_idna_toascii_cold_157();
LAB_001a5ab2:
            pcStack_258 = (char *)0x1a5abf;
            run_test_idna_toascii_cold_158();
LAB_001a5abf:
            pcStack_258 = (char *)0x1a5acc;
            run_test_idna_toascii_cold_159();
LAB_001a5acc:
            pcStack_258 = (char *)0x1a5ad9;
            run_test_idna_toascii_cold_160();
LAB_001a5ad9:
            pcStack_258 = (char *)0x1a5ae6;
            run_test_idna_toascii_cold_161();
LAB_001a5ae6:
            pcStack_258 = (char *)0x1a5af3;
            run_test_idna_toascii_cold_162();
LAB_001a5af3:
            pcStack_258 = (char *)0x1a5b00;
            run_test_idna_toascii_cold_163();
LAB_001a5b00:
            pcStack_258 = (char *)0x1a5b0d;
            run_test_idna_toascii_cold_164();
LAB_001a5b0d:
            pcStack_258 = (char *)0x1a5b1a;
            run_test_idna_toascii_cold_165();
LAB_001a5b1a:
            pcStack_258 = (char *)0x1a5b27;
            run_test_idna_toascii_cold_166();
LAB_001a5b27:
            pcStack_258 = (char *)0x1a5b34;
            run_test_idna_toascii_cold_167();
LAB_001a5b34:
            pcStack_258 = (char *)0x1a5b41;
            run_test_idna_toascii_cold_168();
LAB_001a5b41:
            pcStack_258 = (char *)0x1a5b4e;
            run_test_idna_toascii_cold_169();
LAB_001a5b4e:
            pcStack_258 = (char *)0x1a5b5b;
            run_test_idna_toascii_cold_170();
LAB_001a5b5b:
            pcStack_258 = (char *)0x1a5b68;
            run_test_idna_toascii_cold_171();
LAB_001a5b68:
            pcStack_258 = (char *)0x1a5b75;
            run_test_idna_toascii_cold_172();
LAB_001a5b75:
            pcStack_258 = (char *)0x1a5b82;
            run_test_idna_toascii_cold_173();
LAB_001a5b82:
            pcStack_258 = (char *)0x1a5b8f;
            run_test_idna_toascii_cold_174();
LAB_001a5b8f:
            pcStack_258 = (char *)0x1a5b9c;
            run_test_idna_toascii_cold_175();
LAB_001a5b9c:
            pcStack_258 = (char *)0x1a5ba9;
            run_test_idna_toascii_cold_176();
LAB_001a5ba9:
            pcStack_258 = (char *)0x1a5bb6;
            run_test_idna_toascii_cold_177();
LAB_001a5bb6:
            pcStack_258 = (char *)0x1a5bc3;
            run_test_idna_toascii_cold_178();
LAB_001a5bc3:
            pcStack_258 = (char *)0x1a5bd0;
            run_test_idna_toascii_cold_179();
LAB_001a5bd0:
            pcStack_258 = (char *)0x1a5bdd;
            run_test_idna_toascii_cold_180();
LAB_001a5bdd:
            pcStack_258 = (char *)0x1a5bea;
            run_test_idna_toascii_cold_181();
LAB_001a5bea:
            pcStack_258 = (char *)0x1a5bf7;
            run_test_idna_toascii_cold_182();
LAB_001a5bf7:
            pcStack_258 = (char *)0x1a5c04;
            run_test_idna_toascii_cold_183();
LAB_001a5c04:
            pcStack_258 = (char *)0x1a5c11;
            run_test_idna_toascii_cold_184();
LAB_001a5c11:
            pcStack_258 = (char *)0x1a5c1e;
            run_test_idna_toascii_cold_185();
LAB_001a5c1e:
            pcStack_258 = (char *)0x1a5c2b;
            run_test_idna_toascii_cold_186();
LAB_001a5c2b:
            pcStack_258 = (char *)0x1a5c38;
            run_test_idna_toascii_cold_187();
LAB_001a5c38:
            pcStack_258 = (char *)0x1a5c45;
            run_test_idna_toascii_cold_188();
LAB_001a5c45:
            pcStack_258 = (char *)0x1a5c52;
            run_test_idna_toascii_cold_189();
LAB_001a5c52:
            pcStack_258 = (char *)0x1a5c5f;
            run_test_idna_toascii_cold_190();
LAB_001a5c5f:
            pcStack_258 = (char *)0x1a5c6c;
            run_test_idna_toascii_cold_191();
LAB_001a5c6c:
            pcStack_258 = (char *)0x1a5c79;
            run_test_idna_toascii_cold_192();
LAB_001a5c79:
            pcStack_258 = (char *)0x1a5c86;
            run_test_idna_toascii_cold_193();
LAB_001a5c86:
            pcStack_258 = (char *)0x1a5c93;
            run_test_idna_toascii_cold_194();
LAB_001a5c93:
            pcStack_258 = (char *)0x1a5ca0;
            run_test_idna_toascii_cold_195();
LAB_001a5ca0:
            pcStack_258 = (char *)0x1a5cad;
            run_test_idna_toascii_cold_196();
LAB_001a5cad:
            pcStack_258 = (char *)0x1a5cba;
            run_test_idna_toascii_cold_197();
LAB_001a5cba:
            pcStack_258 = (char *)0x1a5cc7;
            run_test_idna_toascii_cold_198();
LAB_001a5cc7:
            pcStack_258 = (char *)0x1a5cd4;
            run_test_idna_toascii_cold_199();
LAB_001a5cd4:
            pcStack_258 = (char *)0x1a5ce1;
            run_test_idna_toascii_cold_200();
LAB_001a5ce1:
            pcStack_258 = (char *)0x1a5cee;
            run_test_idna_toascii_cold_201();
LAB_001a5cee:
            pcStack_258 = (char *)0x1a5cfb;
            run_test_idna_toascii_cold_202();
LAB_001a5cfb:
            pcStack_258 = (char *)0x1a5d08;
            run_test_idna_toascii_cold_203();
LAB_001a5d08:
            pcStack_258 = (char *)0x1a5d15;
            run_test_idna_toascii_cold_204();
LAB_001a5d15:
            pcStack_258 = (char *)0x1a5d22;
            run_test_idna_toascii_cold_205();
LAB_001a5d22:
            pcStack_258 = (char *)0x1a5d2f;
            run_test_idna_toascii_cold_206();
LAB_001a5d2f:
            pcStack_258 = (char *)0x1a5d3c;
            run_test_idna_toascii_cold_207();
LAB_001a5d3c:
            pcStack_258 = (char *)0x1a5d49;
            run_test_idna_toascii_cold_208();
LAB_001a5d49:
            pcStack_258 = (char *)0x1a5d56;
            run_test_idna_toascii_cold_209();
LAB_001a5d56:
            pcStack_258 = (char *)0x1a5d63;
            run_test_idna_toascii_cold_210();
LAB_001a5d63:
            pcStack_258 = (char *)0x1a5d70;
            run_test_idna_toascii_cold_211();
LAB_001a5d70:
            pcStack_258 = (char *)0x1a5d7d;
            run_test_idna_toascii_cold_212();
LAB_001a5d7d:
            pcStack_258 = (char *)0x1a5d8a;
            run_test_idna_toascii_cold_213();
LAB_001a5d8a:
            pcStack_258 = (char *)0x1a5d97;
            run_test_idna_toascii_cold_214();
LAB_001a5d97:
            pcStack_258 = (char *)0x1a5da4;
            run_test_idna_toascii_cold_215();
LAB_001a5da4:
            pcStack_258 = (char *)0x1a5db1;
            run_test_idna_toascii_cold_216();
LAB_001a5db1:
            pcStack_258 = (char *)0x1a5dbe;
            run_test_idna_toascii_cold_217();
LAB_001a5dbe:
            pcStack_258 = (char *)0x1a5dcb;
            run_test_idna_toascii_cold_218();
LAB_001a5dcb:
            pcStack_258 = (char *)0x1a5dd8;
            run_test_idna_toascii_cold_219();
LAB_001a5dd8:
            pcStack_258 = (char *)0x1a5de5;
            run_test_idna_toascii_cold_220();
LAB_001a5de5:
            pcStack_258 = (char *)0x1a5df2;
            run_test_idna_toascii_cold_221();
LAB_001a5df2:
            pcStack_258 = (char *)0x1a5dff;
            run_test_idna_toascii_cold_222();
LAB_001a5dff:
            pcStack_258 = (char *)0x1a5e0c;
            run_test_idna_toascii_cold_223();
LAB_001a5e0c:
            pcStack_258 = (char *)0x1a5e19;
            run_test_idna_toascii_cold_224();
LAB_001a5e19:
            pcStack_258 = (char *)0x1a5e26;
            run_test_idna_toascii_cold_225();
LAB_001a5e26:
            pcStack_258 = (char *)0x1a5e33;
            run_test_idna_toascii_cold_226();
LAB_001a5e33:
            pcStack_258 = (char *)0x1a5e40;
            run_test_idna_toascii_cold_227();
LAB_001a5e40:
            pcStack_258 = (char *)0x1a5e4d;
            run_test_idna_toascii_cold_228();
LAB_001a5e4d:
            pcStack_258 = (char *)0x1a5e5a;
            run_test_idna_toascii_cold_229();
LAB_001a5e5a:
            pcStack_258 = (char *)0x1a5e67;
            run_test_idna_toascii_cold_230();
LAB_001a5e67:
            pcStack_258 = (char *)0x1a5e74;
            run_test_idna_toascii_cold_231();
LAB_001a5e74:
            pcStack_258 = (char *)0x1a5e81;
            run_test_idna_toascii_cold_232();
LAB_001a5e81:
            pcStack_258 = (char *)0x1a5e8e;
            run_test_idna_toascii_cold_233();
LAB_001a5e8e:
            pcStack_258 = (char *)0x1a5e9b;
            run_test_idna_toascii_cold_234();
LAB_001a5e9b:
            pcStack_258 = (char *)0x1a5ea8;
            run_test_idna_toascii_cold_235();
LAB_001a5ea8:
            pcStack_258 = (char *)0x1a5eb5;
            run_test_idna_toascii_cold_236();
LAB_001a5eb5:
            pcStack_258 = (char *)0x1a5ec2;
            run_test_idna_toascii_cold_237();
          }
          pcStack_258 = (char *)0x1a5ecf;
          run_test_idna_toascii_cold_238();
          pcStack_258 = acStack_240;
          uVar4 = uv_default_loop();
          iVar2 = uv_pipe_init(uVar4,&p1,0);
          uStack_260 = (ulong)iVar2;
          if (uStack_260 == 0) {
            iVar2 = uv_pipe_init(uVar4,&p2,0);
            uStack_260 = (ulong)iVar2;
            if (uStack_260 != 0) goto LAB_001a6124;
            iVar2 = uv_idle_init(uVar4,&idle_handle);
            uStack_260 = (ulong)iVar2;
            if (uStack_260 != 0) goto LAB_001a6133;
            iVar2 = pipe((int *)&uStack_260);
            if (iVar2 != 0) goto LAB_001a6142;
            iVar2 = pipe(newpipefds);
            if (iVar2 != 0) goto LAB_001a6151;
            iVar2 = uv_pipe_open(&p1,uStack_260 & 0xffffffff);
            if (iVar2 != 0) goto LAB_001a6160;
            duped_fd = dup((int)uStack_260);
            if (duped_fd == -1) goto LAB_001a616f;
            iVar2 = uv_read_start(&p1,alloc_buffer,read_data);
            if (iVar2 != 0) goto LAB_001a617e;
            iVar2 = close(uStack_260._4_4_);
            if (iVar2 != 0) goto LAB_001a618d;
            uStack_260 = CONCAT44(0xffffffff,(int)uStack_260);
            iVar2 = uv_run(uVar4,0);
            if (iVar2 == 0) {
              uVar4 = uv_default_loop();
              uv_walk(uVar4,close_walk_cb,0);
              uv_run(uVar4,0);
              uVar4 = uv_default_loop();
              iVar2 = uv_loop_close(uVar4);
              if (iVar2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              goto LAB_001a61ab;
            }
          }
          else {
            run_test_iouring_pollhup_cold_1();
LAB_001a6124:
            run_test_iouring_pollhup_cold_2();
LAB_001a6133:
            run_test_iouring_pollhup_cold_3();
LAB_001a6142:
            run_test_iouring_pollhup_cold_4();
LAB_001a6151:
            run_test_iouring_pollhup_cold_5();
LAB_001a6160:
            run_test_iouring_pollhup_cold_6();
LAB_001a616f:
            run_test_iouring_pollhup_cold_11();
LAB_001a617e:
            run_test_iouring_pollhup_cold_7();
LAB_001a618d:
            run_test_iouring_pollhup_cold_8();
          }
          run_test_iouring_pollhup_cold_9();
LAB_001a61ab:
          run_test_iouring_pollhup_cold_10();
          auVar5 = uv_buf_init(alloc_buffer::slab,0x20);
          *extraout_RDX = auVar5;
          return auVar5._0_4_;
        }
      }
      else {
        apcStack_40[0] = (code *)0x1a155c;
        run_test_utf8_decode1_overrun_cold_2();
      }
      uVar4 = 0x73;
      goto LAB_001a158e;
    }
  }
  else {
    apcStack_40[0] = (code *)0x1a1519;
    run_test_utf8_decode1_overrun_cold_1();
  }
  uVar4 = 0x6d;
LAB_001a158e:
  pcStack_48 = "==";
  pcStack_58 = "b + 1";
  uStack_60 = 0x1a159c;
  pcStack_50 = in_R10;
  apcStack_40[0] = (code *)c;
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-idna.c"
          ,uVar4,"p");
  apcStack_40[0] = (code *)0x1a15a5;
  abort();
}

Assistant:

TEST_IMPL(utf8_decode1_overrun) {
  const char* p;
  char b[1];
  char c[1];

  /* Single byte. */
  p = b;
  b[0] = 0x7F;
  ASSERT_EQ(0x7F, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  /* Multi-byte. */
  p = b;
  b[0] = 0xC0;
  ASSERT_EQ((unsigned) -1, uv__utf8_decode1(&p, b + 1));
  ASSERT_PTR_EQ(p, b + 1);

  b[0] = 0x7F;
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 0, c, c + 1));
  ASSERT_EQ(UV_EINVAL, uv__idna_toascii(b, b + 1, c, c + 1));

  return 0;
}